

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

int __thiscall ImFontAtlas::AddCustomRectRegular(ImFontAtlas *this,int width,int height)

{
  ImFontAtlasCustomRect local_28;
  
  if (0xfffe < width - 1U) {
    __assert_fail("width > 0 && width <= 0xFFFF",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_draw.cpp"
                  ,0x89a,"int ImFontAtlas::AddCustomRectRegular(int, int)");
  }
  if (height - 1U < 0xffff) {
    local_28.X = 0xffff;
    local_28.Y = 0xffff;
    local_28.Font = (ImFont *)0x0;
    local_28.GlyphID = 0;
    local_28.GlyphAdvanceX = 0.0;
    local_28.GlyphOffset.x = 0.0;
    local_28.GlyphOffset.y = 0.0;
    local_28.Width = (unsigned_short)width;
    local_28.Height = (unsigned_short)height;
    ImVector<ImFontAtlasCustomRect>::push_back(&this->CustomRects,&local_28);
    return (this->CustomRects).Size + -1;
  }
  __assert_fail("height > 0 && height <= 0xFFFF",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_draw.cpp"
                ,0x89b,"int ImFontAtlas::AddCustomRectRegular(int, int)");
}

Assistant:

int ImFontAtlas::AddCustomRectRegular(int width, int height)
{
    IM_ASSERT(width > 0 && width <= 0xFFFF);
    IM_ASSERT(height > 0 && height <= 0xFFFF);
    ImFontAtlasCustomRect r;
    r.Width = (unsigned short)width;
    r.Height = (unsigned short)height;
    CustomRects.push_back(r);
    return CustomRects.Size - 1; // Return index
}